

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace.cc
# Opt level: O2

char * TEST_bump_stacktrace_implementation(char *suggestion)

{
  char *__s2;
  int iVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  
  if (get_stack_impl_inited == '\0') {
    fwrite("Supported stacktrace methods:\n",0x1e,1,_stderr);
    for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 8) {
      fprintf(_stderr,"* %s\n",*(undefined8 *)(*(long *)((long)all_impls + lVar4) + 0x20));
    }
    fwrite("\n\n",2,1,_stderr);
    get_stack_impl_inited = '\x01';
  }
  uVar3 = (ulong)(uint)TEST_bump_stacktrace_implementation::selection;
  iVar1 = TEST_bump_stacktrace_implementation::selection + 1;
  lVar4 = 0;
  do {
    if (4 - uVar3 == lVar4) {
      return (char *)0x0;
    }
    TEST_bump_stacktrace_implementation::selection = iVar1 + (int)lVar4;
    get_stack_impl = all_impls[lVar4 + uVar3];
    if (suggestion == (char *)0x0) {
      if (3 - uVar3 != lVar4) {
        return get_stack_impl->name;
      }
    }
    else {
      __s2 = get_stack_impl->name;
      iVar2 = strcmp(suggestion,__s2);
      if ((3 - uVar3 != lVar4) && (iVar2 == 0)) {
        return __s2;
      }
    }
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

const char* TEST_bump_stacktrace_implementation(const char* suggestion) {
  static int selection;
  constexpr int n = sizeof(all_impls)/sizeof(all_impls[0]);

  if (!get_stack_impl_inited) {
    fprintf(stderr, "Supported stacktrace methods:\n");
    for (int i = 0; i < n; i++) {
      fprintf(stderr, "* %s\n", all_impls[i]->name);
    }
    fprintf(stderr, "\n\n");
    get_stack_impl_inited = true;
  }

  do {
    if (selection == n) {
      return nullptr;
    }
    get_stack_impl = all_impls[selection++];

    if (suggestion && strcmp(suggestion, get_stack_impl->name) != 0) {
      continue;
    }
    if (get_stack_impl == &impl__null) {
      // skip null implementation
      continue;
    }
#ifdef HAVE_GST_arm
    if (get_stack_impl == &impl__arm) {
      // "arm" backtracer is hopelessly broken. So don't test. We
      // still ship it, though, just in case.
      continue;
    }
#endif  // HAVE_GST_arm
#if defined(HAVE_GST_generic_fp) && (!__x86_64__ && !__i386__ && !__aarch64__ && !__riscv)
    // Those "major" architectures have functional frame pointer
    // backtracer and they're built with -fno-omit-frame-pointers
    // -mno-omit-leaf-frame-pointer. So we do expect those tests to
    // succeed. Everyone else (e.g. 32-bit legacy arm) is unlikely to
    // pass.
    if (get_stack_impl == &impl__generic_fp || get_stack_impl == &impl__generic_fp_unsafe) {
      continue;
    }
#endif  // generic_fp && !"good architecture"
    break;
  } while (true);

  return get_stack_impl->name;
}